

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O0

void __thiscall
FIX::DateTime::DateTime
          (DateTime *this,int year,int month,int day,int hour,int minute,int second,int fraction,
          int precision)

{
  int iVar1;
  int64_t iVar2;
  int nanos;
  int minute_local;
  int hour_local;
  int day_local;
  int month_local;
  int year_local;
  DateTime *this_local;
  
  this->_vptr_DateTime = (_func_int **)&PTR__DateTime_0045d1e0;
  iVar1 = julianDate(year,month,day);
  this->m_date = iVar1;
  iVar1 = convertToNanos(fraction,precision);
  iVar2 = makeHMS(hour,minute,second,iVar1);
  this->m_time = iVar2;
  return;
}

Assistant:

DateTime( int year, int month, int day,
            int hour, int minute, int second, int fraction, int precision )
  {
    m_date = julianDate( year, month, day );
    int nanos = convertToNanos(fraction, precision);
    m_time = makeHMS( hour, minute, second, nanos );
  }